

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KrazyMeans.cpp
# Opt level: O2

void __thiscall KrazyMeans::dumpLabels(KrazyMeans *this,string *file_name)

{
  element_type *peVar1;
  size_t v;
  ulong uVar2;
  long lVar3;
  ofstream file;
  
  std::ofstream::ofstream(&file,(string *)file_name,_S_bin);
  lVar3 = 0;
  for (uVar2 = 0;
      peVar1 = (this->data_set).super___shared_ptr<DataSet,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
      uVar2 < (ulong)(((long)*(pointer *)
                              ((long)&(peVar1->vectors).
                                      super__Vector_base<FeatureVec,_std::allocator<FeatureVec>_>.
                                      _M_impl.super__Vector_impl_data + 8) -
                      (long)(peVar1->vectors).
                            super__Vector_base<FeatureVec,_std::allocator<FeatureVec>_>._M_impl.
                            super__Vector_impl_data._M_start) / 0x18); uVar2 = uVar2 + 1) {
    std::ostream::write((char *)&file,
                        (long)(this->labels).
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start + lVar3);
    lVar3 = lVar3 + 8;
  }
  std::ofstream::~ofstream(&file);
  return;
}

Assistant:

void KrazyMeans::dumpLabels(std::string file_name) {
  std::ofstream file(file_name, std::ios::binary);

  // Write labels as uint16_t
  for (size_t v = 0; v < data_set->size(); v++) {
    file.write((char *) &labels[v], sizeof(size_t));
  }
}